

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O0

bool anon_unknown.dwarf_14bc64a::isUnionMemberType(Type *left,Type *right)

{
  bool bVar1;
  Type *right_00;
  Type *in_RSI;
  Type *ft;
  FieldSymbol *field;
  specific_symbol_iterator<slang::ast::FieldSymbol> __end1;
  specific_symbol_iterator<slang::ast::FieldSymbol> __begin1;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  *__range1;
  Type *rt;
  Type *lt;
  specific_symbol_iterator<slang::ast::FieldSymbol> *in_stack_ffffffffffffff98;
  Type *in_stack_ffffffffffffffa0;
  Scope *in_stack_ffffffffffffffb0;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  local_40;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
  *local_30;
  Type *local_28;
  
  right_00 = slang::ast::Type::getCanonicalType(in_stack_ffffffffffffffa0);
  local_28 = slang::ast::Type::getCanonicalType(in_stack_ffffffffffffffa0);
  bVar1 = slang::ast::Type::isPackedUnion((Type *)0x9fa676);
  if (bVar1) {
    slang::ast::Symbol::as<slang::ast::Scope>((Symbol *)0x9fa68e);
    local_40 = slang::ast::Scope::membersOfType<slang::ast::FieldSymbol>(in_stack_ffffffffffffffb0);
    local_30 = &local_40;
    std::ranges::
    subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
    ::begin(local_30);
    std::ranges::
    subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_(std::ranges::subrange_kind)0>
    ::end(local_30);
    while (bVar1 = slang::
                   operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
                             ((self_type *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      slang::
      iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>::
      operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                 *)0x9fa6e9);
      in_stack_ffffffffffffffa0 = slang::ast::ValueSymbol::getType((ValueSymbol *)0x9fa6f8);
      bVar1 = slang::ast::Type::isMatching(left,right);
      if ((bVar1) || (bVar1 = isUnionMemberType(in_RSI,right_00), bVar1)) {
        return true;
      }
      slang::
      iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>::
      operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_>
                ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>,_false>
                  *)in_stack_ffffffffffffffa0);
    }
  }
  return false;
}

Assistant:

bool isUnionMemberType(const Type& left, const Type& right) {
    const Type& lt = left.getCanonicalType();
    const Type& rt = right.getCanonicalType();
    if (!lt.isPackedUnion())
        return false;

    for (auto& field : lt.as<Scope>().membersOfType<FieldSymbol>()) {
        auto& ft = field.getType();
        if (ft.isMatching(rt) || isUnionMemberType(ft, rt))
            return true;
    }
    return false;
}